

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

bool findInBlock(QTextBlock *block,QRegularExpression *expr,int offset,FindFlags options,
                QTextCursor *cursor)

{
  ushort uVar1;
  char16_t cVar2;
  QTextDocumentPrivate *p;
  QSharedDataPointer<QTextCursorPrivate> QVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  QRegularExpressionMatch *pQVar8;
  bool bVar9;
  long in_FS_OFFSET;
  QRegularExpressionMatch match;
  QTextCursor local_68;
  undefined1 *local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::text(&local_58,block);
  QString::replace((QChar)(char16_t)&local_58,(QChar)0xa0,0x20);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)&local_60);
  do {
    if ((offset < 0) ||
       (pQVar8 = (QRegularExpressionMatch *)(ulong)(uint)offset, (ulong)local_58.d.size < pQVar8)) {
LAB_004cbb92:
      bVar9 = false;
      goto LAB_004cbb94;
    }
    if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
               super_QFlagsStorage<QTextDocument::FindFlag>.i & 1) == 0) {
      uVar5 = QString::indexOf((QRegularExpression *)&local_58,(longlong)expr,pQVar8);
    }
    else {
      uVar5 = QString::lastIndexOf((QRegularExpression *)&local_58,(longlong)expr,pQVar8);
    }
    if (uVar5 == 0xffffffff) goto LAB_004cbb92;
    if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
               super_QFlagsStorage<QTextDocument::FindFlag>.i & 4) == 0) break;
    iVar6 = QRegularExpressionMatch::capturedLength((int)(QRegularExpressionMatch *)&local_60);
    iVar6 = iVar6 + uVar5;
    if (uVar5 == 0) {
LAB_004cbac2:
      bVar9 = true;
      if ((QRegularExpressionMatch *)(long)iVar6 != (QRegularExpressionMatch *)local_58.d.size) {
        cVar2 = local_58.d.ptr[iVar6];
        if (((ushort)cVar2 - 0x30 < 10) ||
           ((ushort)cVar2 - 0x41 < 0x3a && (ushort)cVar2 - 0x61 < 0xfffffffa)) goto LAB_004cbb07;
        if (0x7f < (ushort)cVar2) {
          cVar4 = QChar::isLetterOrNumber_helper((uint)(ushort)cVar2);
          if (cVar4 != '\0') goto LAB_004cbb07;
        }
      }
    }
    else {
      uVar1 = *(ushort *)
               ((long)local_58.d.ptr + ((long)(((ulong)uVar5 << 0x20) + -0x100000000) >> 0x1f));
      if ((9 < uVar1 - 0x30) && (0x39 < uVar1 - 0x41 || 0xfffffff9 < uVar1 - 0x61)) {
        if (0x7f < uVar1) {
          cVar4 = QChar::isLetterOrNumber_helper((uint)uVar1);
          if (cVar4 != '\0') goto LAB_004cbb07;
        }
        goto LAB_004cbac2;
      }
LAB_004cbb07:
      offset = iVar6 + 1;
      if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
                 super_QFlagsStorage<QTextDocument::FindFlag>.i & 1) != 0) {
        offset = uVar5 - 1;
      }
      uVar5 = 0xffffffff;
      bVar9 = false;
    }
  } while (!bVar9);
  p = block->p;
  iVar6 = QTextBlock::position(block);
  QTextCursor::QTextCursor(&local_68,p,uVar5 + iVar6);
  QVar3.d.ptr = (totally_ordered_wrapper<QTextCursorPrivate_*>)(cursor->d).d.ptr;
  (cursor->d).d.ptr = (QTextCursorPrivate *)local_68;
  local_68.d.d.ptr =
       (QSharedDataPointer<QTextCursorPrivate>)(QSharedDataPointer<QTextCursorPrivate>)QVar3.d.ptr;
  QTextCursor::~QTextCursor(&local_68);
  iVar6 = QTextCursor::position(cursor);
  iVar7 = QRegularExpressionMatch::capturedLength((int)&local_60);
  QTextCursor::setPosition(cursor,iVar6 + iVar7,KeepAnchor);
  bVar9 = true;
LAB_004cbb94:
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_60);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

static bool findInBlock(const QTextBlock &block, const QRegularExpression &expr, int offset,
                        QTextDocument::FindFlags options, QTextCursor *cursor)
{
    QString text = block.text();
    text.replace(QChar::Nbsp, u' ');
    QRegularExpressionMatch match;
    int idx = -1;

    while (offset >= 0 && offset <= text.size()) {
        idx = (options & QTextDocument::FindBackward) ?
               text.lastIndexOf(expr, offset, &match) : text.indexOf(expr, offset, &match);
        if (idx == -1)
            return false;

        if (options & QTextDocument::FindWholeWords) {
            const int start = idx;
            const int end = start + match.capturedLength();
            if ((start != 0 && text.at(start - 1).isLetterOrNumber())
                || (end != text.size() && text.at(end).isLetterOrNumber())) {
                //if this is not a whole word, continue the search in the string
                offset = (options & QTextDocument::FindBackward) ? idx-1 : end+1;
                idx = -1;
                continue;
            }
        }
        //we have a hit, return the cursor for that.
        *cursor = QTextCursorPrivate::fromPosition(const_cast<QTextDocumentPrivate *>(QTextDocumentPrivate::get(block)),
                                                   block.position() + idx);
        cursor->setPosition(cursor->position() + match.capturedLength(), QTextCursor::KeepAnchor);
        return true;
    }
    return false;
}